

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O0

int mbedtls_asn1_write_octet_string(uchar **p,uchar *start,uchar *buf,size_t size)

{
  int iVar1;
  int iVar2;
  size_t len;
  int ret;
  size_t size_local;
  uchar *buf_local;
  uchar *start_local;
  uchar **p_local;
  
  iVar1 = mbedtls_asn1_write_raw_buffer(p,start,buf,size);
  p_local._4_4_ = iVar1;
  if ((-1 < iVar1) &&
     (iVar2 = mbedtls_asn1_write_len(p,start,(long)iVar1), p_local._4_4_ = iVar2, -1 < iVar2)) {
    p_local._4_4_ = mbedtls_asn1_write_tag(p,start,'\x04');
    if (-1 < p_local._4_4_) {
      p_local._4_4_ = p_local._4_4_ + iVar2 + iVar1;
    }
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_write_octet_string( unsigned char **p, unsigned char *start,
                             const unsigned char *buf, size_t size )
{
    int ret;
    size_t len = 0;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_raw_buffer( p, start, buf, size ) );

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_OCTET_STRING ) );

    return( (int) len );
}